

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O2

void __thiscall
OpenMD::CoordinationNumber::CoordinationNumber
          (CoordinationNumber *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType rCut,int bins)

{
  SelectionManager *this_00;
  SelectionEvaluator *this_01;
  SelectionManager *this_02;
  SelectionEvaluator *this_03;
  int iVar1;
  ostream *poVar2;
  string paramString;
  stringstream params;
  SelectionSet local_200;
  string local_1e8;
  string *local_1c8;
  string *local_1c0;
  undefined1 local_1b8 [392];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,bins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__CoordinationNumber_002ed5f0;
  this->rCut_ = rCut;
  this->bins_ = bins;
  std::__cxx11::string::string((string *)&this->sele1_,(string *)sele1);
  this_00 = &this->seleMan1_;
  local_1c0 = &this->sele1_;
  SelectionManager::SelectionManager(this_00,info);
  this_01 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  local_1c8 = &this->sele2_;
  std::__cxx11::string::string((string *)local_1c8,(string *)sele2);
  this_02 = &this->seleMan2_;
  SelectionManager::SelectionManager(this_02,info);
  this_03 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_03,info);
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Coordination Number Distribution",(allocator<char> *)&local_1e8);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix(&local_1e8,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_1e8,".cn");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_1e8);
  this->nnMax_ = 0xc;
  this->delta_ = 18.0 / (double)this->bins_;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::operator<<((ostream *)(local_1b8 + 0x10)," rcut = ");
  poVar2 = std::ostream::_M_insert<double>(this->rCut_);
  poVar2 = std::operator<<(poVar2,", nbins = ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->bins_);
  poVar2 = std::operator<<(poVar2,", nnMax = ");
  std::ostream::operator<<((ostream *)poVar2,this->nnMax_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  SelectionEvaluator::loadScriptString(this_01,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_200,this_01);
    SelectionManager::setSelectionSet(this_00,&local_200);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_200.bitsets_);
    iVar1 = SelectionManager::getSelectionCount(this_00);
    this->selectionCount1_ = iVar1;
  }
  SelectionEvaluator::loadScriptString(this_03,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_200,this_03);
    SelectionManager::setSelectionSet(this_02,&local_200);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_200.bitsets_);
    iVar1 = SelectionManager::getSelectionCount(this_02);
    this->selectionCount2_ = iVar1;
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

CoordinationNumber::CoordinationNumber(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele1,
                                         const std::string& sele2,
                                         RealType rCut, int bins) :
      StaticAnalyser(info, filename, bins),
      rCut_(rCut), bins_(bins), sele1_(sele1), seleMan1_(info),
      evaluator1_(info), sele2_(sele2), seleMan2_(info), evaluator2_(info) {
    setAnalysisType("Coordination Number Distribution");
    setOutputName(getPrefix(filename) + ".cn");

    nnMax_           = 12;
    RealType binMax_ = nnMax_ * 1.5;
    delta_           = binMax_ / bins_;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << bins_
           << ", nnMax = " << nnMax_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      selectionCount1_ = seleMan1_.getSelectionCount();
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      selectionCount2_ = seleMan2_.getSelectionCount();
    }
  }